

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

Iterator * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::upper_bound
          (Iterator *__return_storage_ptr__,
          Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          int *key)

{
  longlong *plVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  self_type **ppsVar7;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this_00;
  undefined1 auVar8 [16];
  undefined8 in_XMM0_Qa;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  plVar1 = &(this->stats_).num_lookups;
  *plVar1 = *plVar1 + 1;
  this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *
            )this->root_node_;
  if ((this_00->super_AlexNode<int,_int>).is_leaf_ == false) {
    iVar5 = *key;
    auVar11._0_8_ = (double)iVar5;
    auVar11._8_8_ = in_XMM0_Qa;
    do {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = (this_00->super_AlexNode<int,_int>).model_.a_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (this_00->super_AlexNode<int,_int>).model_.b_;
      auVar8 = vfmadd213sd_fma(auVar10,auVar11,auVar8);
      uVar6 = *(int *)&this_00->allocator_ - 1;
      dVar9 = auVar8._0_8_;
      uVar3 = ~((int)dVar9 >> 0x1f) & (int)dVar9;
      if ((int)uVar3 <= (int)uVar6) {
        uVar6 = uVar3;
      }
      this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                 *)(&(this_00->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar6];
    } while ((this_00->super_AlexNode<int,_int>).is_leaf_ != true);
    plVar1 = &(this->stats_).num_node_lookups;
    *plVar1 = *plVar1 + (long)(this_00->super_AlexNode<int,_int>).level_;
    auVar11 = vcvtdq2pd_avx(ZEXT416((uint)(int)(dVar9 + 0.5)));
    auVar2._8_8_ = 0x7fffffffffffffff;
    auVar2._0_8_ = 0x7fffffffffffffff;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar9 - auVar11._0_8_;
    auVar8 = vandpd_avx512vl(auVar12,auVar2);
    if (auVar8._0_8_ <= dVar9 * 2.220446049250313e-15) {
      if (auVar11._0_8_ <= dVar9) {
        if (this_00->prev_leaf_ ==
            (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *
            )0x0) goto LAB_00103637;
        iVar4 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                ::last_key(this_00->prev_leaf_);
        if (iVar4 < iVar5) goto LAB_00103637;
        ppsVar7 = &this_00->prev_leaf_;
      }
      else {
        if (this_00->next_leaf_ ==
            (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *
            )0x0) goto LAB_00103637;
        iVar4 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                ::first_key(this_00->next_leaf_);
        if (iVar5 < iVar4) goto LAB_00103637;
        ppsVar7 = &this_00->next_leaf_;
      }
      this_00 = *ppsVar7;
    }
  }
LAB_00103637:
  iVar5 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
          find_upper(this_00,key);
  Iterator::Iterator(__return_storage_ptr__,this_00,iVar5);
  return __return_storage_ptr__;
}

Assistant:

typename self_type::Iterator upper_bound(const T& key) {
    stats_.num_lookups++;
    data_node_type* leaf = get_leaf(key);
    int idx = leaf->find_upper(key);
    return Iterator(leaf, idx);  // automatically handles the case where idx ==
                                 // leaf->data_capacity
  }